

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void __thiscall kratos::PortLegalityFixVisitor::visit(PortLegalityFixVisitor *this,Generator *gen)

{
  Generator *pGVar1;
  undefined8 uVar2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Generator *pGVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  InternalException *this_00;
  size_type *psVar8;
  undefined1 local_108 [8];
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sinks;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> local_90;
  shared_ptr<kratos::Var> local_80;
  undefined1 local_70 [8];
  shared_ptr<kratos::SwitchStmt> case_;
  undefined1 local_50 [8];
  shared_ptr<kratos::Expr> expr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pGVar1 = gen->parent_generator_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&sinks._M_h._M_single_bucket,&(gen->ports_)._M_t);
  do {
    if (port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)&port_names)
    {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sinks._M_h._M_single_bucket);
      return;
    }
    port_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    Generator::get_port((Generator *)
                        &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(string *)gen);
    if (*(int *)&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 [0x27]._vptr__Sp_counted_base == 0) {
      iVar5 = (*(expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_vptr__Sp_counted_base[0xe])();
      uVar2 = *(undefined8 *)(CONCAT44(extraout_var,iVar5) + 0x10);
      (*(expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[0xe])();
      std::
      _Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _Hashtable<std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,true,false>>
                ((_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_108,uVar2,0,0,local_70,&local_80,local_50);
      psVar8 = &sinks._M_h._M_bucket_count;
      while( true ) {
        psVar8 = (size_type *)*psVar8;
        if (psVar8 == (size_type *)0x0) break;
        pGVar6 = Stmt::generator_parent((Stmt *)((__node_base *)(psVar8 + 1))->_M_nxt);
        if (pGVar6 == pGVar1) {
          iVar5 = (*(expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base[0x10])();
          if (*(long *)(CONCAT44(extraout_var_00,iVar5) + 0x18) != 0) {
            std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<kratos::Var,void>
                      ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_80,
                       (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                       (*(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_00,iVar5) + 0x10) + 8) +
                                 200) + 0x68));
            pGVar6 = (Generator *)
                     (*(code *)((_Hash_node_base *)
                               ((local_80.
                                 super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->super_IRNode)._vptr_IRNode)[0xd]._M_nxt)();
            if (pGVar6 != pGVar1) {
              this_00 = (InternalException *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_70,"Invalid src generator",(allocator<char> *)local_50);
              InternalException::InternalException(this_00,(string *)local_70);
              __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
            }
            iVar5 = (*(expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi)->_vptr__Sp_counted_base[0xd])();
            std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<kratos::Var,void>
                      ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_70,
                       (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                       (((__node_base *)(psVar8 + 1))->_M_nxt[0x18]._M_nxt + 0xd));
            bVar4 = Generator::is_auxiliary_var
                              ((Generator *)CONCAT44(extraout_var_01,iVar5),
                               (shared_ptr<kratos::Var> *)local_70);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&case_);
            p_Var3 = ((__node_base *)(psVar8 + 1))->_M_nxt;
            if (bVar4) {
              lVar7 = (*(code *)p_Var3->_M_nxt[4]._M_nxt)();
              if (*(int *)(lVar7 + 0x78) == 0) {
                Stmt::as<kratos::IfStmt>((Stmt *)local_70);
                std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_50,
                           (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                           ((long)local_70 + 0xc0));
                iVar5 = *(int *)((long)local_50 + 0x168);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr);
                if (iVar5 == 1) {
                  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            (&local_90,
                             (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                             ((long)local_70 + 0xc0));
                  Var::as<kratos::Expr>((Var *)local_50);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_90._M_refcount);
                  change_var_expr((shared_ptr<kratos::Expr> *)local_50,
                                  (Var *)expr.
                                         super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi,
                                  local_80.
                                  super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                  ,false);
                  goto LAB_0020b2d9;
                }
                IfStmt::set_predicate((IfStmt *)local_70,&local_80);
              }
              else {
                Stmt::as<kratos::SwitchStmt>((Stmt *)local_70);
                std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_50,
                           (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                           ((long)local_70 + 0xc0));
                iVar5 = *(int *)((long)local_50 + 0x168);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr);
                if (iVar5 == 1) {
                  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            (&local_90,
                             (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                             ((long)local_70 + 0xc0));
                  Var::as<kratos::Expr>((Var *)local_50);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_90._M_refcount);
                  change_var_expr((shared_ptr<kratos::Expr> *)local_50,
                                  (Var *)expr.
                                         super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi,
                                  local_80.
                                  super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                  ,false);
LAB_0020b2d9:
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr);
                }
                else {
                  SwitchStmt::set_target((SwitchStmt *)local_70,&local_80);
                }
              }
LAB_0020b30c:
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&case_);
            }
            else {
              if (*(int *)&p_Var3[0x19]._M_nxt[0x2d]._M_nxt == 1) {
                Var::as<kratos::Expr>((Var *)local_70);
                change_var_expr((shared_ptr<kratos::Expr> *)local_70,
                                (Var *)expr.
                                       super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi,
                                local_80.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,false);
                goto LAB_0020b30c;
              }
              p_Var3[0x19]._M_nxt =
                   (_Hash_node_base *)
                   local_80.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_80.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
        }
      }
      std::
      _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_108);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         std::_Rb_tree_increment
                   ((_Rb_tree_node_base *)
                    port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
  } while( true );
}

Assistant:

void visit(Generator* gen) override {
        auto const* parent_gen = gen->parent_generator();
        auto port_names = gen->get_port_names();
        for (auto const& port_name : port_names) {
            auto const& port = gen->get_port(port_name);
            if (port->port_direction() != PortDirection::In) continue;
            auto sinks = std::unordered_set(port->sinks().begin(), port->sinks().end());
            for (auto const& stmt : sinks) {
                if (stmt->generator_parent() != parent_gen) continue;
                // if we have any sinks that's in the parent scope, it's an illegal assignment
                // we have to figure out the source
                auto const& sources = port->sources();
                if (sources.empty()) continue;
                auto const& src = (*sources.begin())->right()->shared_from_this();
                if (src->generator() != parent_gen)
                    throw InternalException("Invalid src generator");
                // replace the source with this src
                // depends on the context, it could be an auxiliary stmt
                if (port->generator()->is_auxiliary_var(stmt->left()->shared_from_this())) {
                    auto* parent_stmt = reinterpret_cast<Stmt*>(stmt->parent());
                    if (parent_stmt->type() == StatementType::If) {
                        auto if_ = parent_stmt->as<IfStmt>();
                        if (if_->predicate()->type() == VarType::Expression) {
                            auto expr = if_->predicate()->as<Expr>();
                            change_var_expr(expr, port.get(), src.get(), false);
                        } else {
                            if_->set_predicate(src);
                        }
                    } else {
                        // case statement
                        auto case_ = parent_stmt->as<SwitchStmt>();
                        if (case_->target()->type() == VarType::Expression) {
                            auto expr = case_->target()->as<Expr>();
                            change_var_expr(expr, port.get(), src.get(), false);
                        } else {
                            case_->set_target(src);
                        }
                    }
                } else {
                    auto* right = stmt->right();
                    if (right->type() == VarType::Expression) {
                        auto expr = right->as<Expr>();
                        change_var_expr(expr, port.get(), src.get(), false);
                    } else {
                        stmt->right() = src.get();
                    }
                }
            }
        }
    }